

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

int __thiscall
cmCTestMultiProcessHandler::SearchByName(cmCTestMultiProcessHandler *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference ppVar3;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *p;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  int index;
  string *name_local;
  cmCTestMultiProcessHandler *this_local;
  
  __range1._4_4_ = -1;
  __end1 = std::
           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ::begin(&(this->Properties).
                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  );
  p = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
      std::
      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
      ::end(&(this->Properties).
             super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           );
  while (bVar1 = std::operator!=(&__end1,(_Self *)&p), bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator*(&__end1);
    _Var2 = std::operator==(&ppVar3->second->Name,name);
    if (_Var2) {
      __range1._4_4_ = ppVar3->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int cmCTestMultiProcessHandler::SearchByName(std::string const& name)
{
  int index = -1;

  for (auto const& p : this->Properties) {
    if (p.second->Name == name) {
      index = p.first;
    }
  }
  return index;
}